

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

BOOL __thiscall
Js::CustomExternalWrapperObject::SetProperty
          (CustomExternalWrapperObject *this,JavascriptString *propertyNameString,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  anon_class_40_5_3a40f70d fn_00;
  PropertyOperationFlags propertyOperationFlags;
  Var newValue;
  BOOL BVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  PropertyValueInfo **local_78;
  anon_class_8_1_c304e0ef local_70;
  undefined1 *local_68;
  anon_class_40_5_3a40f70d fn;
  anon_class_8_1_c304e0ef getPropertyName;
  PropertyValueInfo *info_local;
  Var pvStack_28;
  PropertyOperationFlags flags_local;
  Var value_local;
  JavascriptString *propertyNameString_local;
  CustomExternalWrapperObject *this_local;
  
  getPropertyName.propertyNameString = (JavascriptString **)info;
  info_local._4_4_ = flags;
  pvStack_28 = value;
  value_local = propertyNameString;
  propertyNameString_local = (JavascriptString *)this;
  BVar1 = VerifyObjectAlive(this);
  if (BVar1 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    this_00 = ScriptContext::GetThreadContext(pSVar2);
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    ThreadContext::ProbeStack(this_00,0xc00,pSVar2,(PVOID)0x0);
    newValue = pvStack_28;
    local_70.propertyNameString = (JavascriptString **)&value_local;
    local_68 = (undefined1 *)&stack0xffffffffffffffd8;
    fn.this = (CustomExternalWrapperObject *)&value_local;
    fn.propertyNameString = (JavascriptString **)((long)&info_local + 4);
    fn.flags = (PropertyOperationFlags *)&getPropertyName;
    fn.value = (Var *)this;
    fn.info = (PropertyValueInfo **)local_70.propertyNameString;
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    propertyOperationFlags = info_local._4_4_;
    memcpy(&local_98,&local_68,0x28);
    fn_00.this = (CustomExternalWrapperObject *)uStack_90;
    fn_00.value = (Var *)local_98;
    fn_00.propertyNameString = (JavascriptString **)local_88;
    fn_00.flags = (PropertyOperationFlags *)uStack_80;
    fn_00.info = local_78;
    this_local._4_4_ =
         SetPropertyTrap<Js::CustomExternalWrapperObject::SetProperty(Js::JavascriptString*,void*,Js::PropertyOperationFlags,Js::PropertyValueInfo*)::__0,Js::CustomExternalWrapperObject::SetProperty(Js::JavascriptString*,void*,Js::PropertyOperationFlags,Js::PropertyValueInfo*)::__1>
                   (this,this,SetPropertyKind,local_70,newValue,pSVar2,propertyOperationFlags,0,
                    fn_00,(PropertyValueInfo *)getPropertyName.propertyNameString);
  }
  return this_local._4_4_;
}

Assistant:

BOOL CustomExternalWrapperObject::SetProperty(Js::JavascriptString* propertyNameString, Js::Var value, Js::PropertyOperationFlags flags, Js::PropertyValueInfo* info)
{
    if (!this->VerifyObjectAlive()) return FALSE;
    PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        return propertyNameString;
    };

    auto fn = [&]()->BOOL
    {
        // setting the value could be deferred and now we are on a different context from
        // make sure the value has the same context as the containing object.
        value = Js::CrossSite::MarshalVar(this->GetScriptContext(), value);
        return DynamicObject::SetProperty(propertyNameString, value, flags, info);
    };

    return SetPropertyTrap(this, CustomExternalWrapperObject::SetPropertyTrapKind::SetPropertyKind, getPropertyName, value, GetScriptContext(), flags, FALSE, fn, info);
}